

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockMultiNestedStructCase::init
          (BlockMultiNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *pvVar1;
  ShaderInterface *this_00;
  BlockMultiNestedStructCase *pBVar2;
  deUint32 extraout_EAX;
  deUint32 dVar3;
  StructType *this_01;
  StructType *this_02;
  BufferBlock *this_03;
  BufferBlock *this_04;
  VarType local_90;
  BufferVar local_78;
  BlockMultiNestedStructCase *local_38;
  
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = bb::ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_MAT3,PRECISION_LOWP);
  glu::StructType::addMember(this_01,"a",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType(&local_90,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_78,&local_90,4);
  glu::StructType::addMember(this_01,"b",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"c",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  this_02 = bb::ShaderInterface::allocStruct(this_00,"T");
  glu::VarType::VarType((VarType *)&local_78,TYPE_UINT,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType((VarType *)&local_78,this_01);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType((VarType *)&local_78,TYPE_BOOL_VEC4,PRECISION_LAST);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  this_03 = bb::ShaderInterface::allocBlock(this_00,"BlockA");
  glu::VarType::VarType(&local_90,TYPE_FLOAT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_78,"a",&local_90,0x1800);
  pvVar1 = &this_03->m_variables;
  local_38 = this;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,this_01);
  bb::BufferVar::BufferVar(&local_78,"b",&local_90,0x1000);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_UINT_VEC3,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_78,"c",&local_90,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  std::__cxx11::string::_M_replace
            ((ulong)&this_03->m_instanceName,0,(char *)(this_03->m_instanceName)._M_string_length,
             0x1bc80f8);
  this_03->m_flags = local_38->m_flagsA;
  this_04 = bb::ShaderInterface::allocBlock(this_00,"BlockB");
  glu::VarType::VarType(&local_90,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_78,"a",&local_90,0x1000);
  pvVar1 = &this_04->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,this_02);
  bb::BufferVar::BufferVar(&local_78,"b",&local_90,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_BOOL_VEC4,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_78,"c",&local_90,0);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_BOOL,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_78,"d",&local_90,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  std::__cxx11::string::_M_replace
            ((ulong)&this_04->m_instanceName,0,(char *)(this_04->m_instanceName)._M_string_length,
             0x1bc8106);
  pBVar2 = local_38;
  dVar3 = local_38->m_flagsB;
  this_04->m_flags = dVar3;
  if (0 < local_38->m_numInstances) {
    bb::BufferBlock::setArraySize(this_03,local_38->m_numInstances);
    bb::BufferBlock::setArraySize(this_04,pBVar2->m_numInstances);
    dVar3 = extraout_EAX;
  }
  return dVar3;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_LOWP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP)); // \todo [pyry] UNUSED
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST));

		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(&typeS), ACCESS_WRITE));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}